

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseFlag(char *str,char *flag_name,int32_t *value)

{
  char *pcVar1;
  bool in_stack_0000003f;
  char *value_str;
  int32_t *in_stack_00000068;
  char *in_stack_00000070;
  Message *in_stack_00000078;
  char (*in_stack_ffffffffffffff98) [21];
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Message *in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  pcVar1 = ParseFlagValue((char *)value,value_str,in_stack_0000003f);
  if (pcVar1 == (char *)0x0) {
    local_1 = false;
  }
  else {
    Message::Message(in_stack_ffffffffffffffd0);
    Message::operator<<((Message *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
    Message::operator<<((Message *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                        (char **)in_stack_ffffffffffffff98);
    local_1 = ParseInt32(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    Message::~Message((Message *)0x191106);
  }
  return local_1;
}

Assistant:

bool ParseFlag(const char* str, const char* flag_name, int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag_name, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag_name, value_str,
                    value);
}